

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::SetVariableResponse>::destruct
          (BasicTypeInfo<dap::SetVariableResponse> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::SetVariableResponse> *this_local;
  
  SetVariableResponse::~SetVariableResponse((SetVariableResponse *)ptr);
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }